

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

void fall_through(boolean td)

{
  int iVar1;
  long lVar2;
  xchar xVar3;
  xchar xVar4;
  boolean bVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  trap *ptVar10;
  bool bVar11;
  d_level dtmp;
  char msgbuf [256];
  d_level local_142;
  ulong local_140;
  char local_138 [264];
  
  xVar3 = dunlev(&u.uz);
  if (((((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) &&
      ((u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0 ||
       ((youmonst.data)->mlet == '\x05')))) && (u.uz.dnum != dungeon_topology.d_sokoban_dnum)) {
    return;
  }
  local_140 = (ulong)(uint)(int)xVar3;
  lVar2 = 0;
  do {
    lVar7 = lVar2;
    uVar6 = mt_random();
    if ((uVar6 & 3) != 0) break;
    xVar4 = dunlevs_in_dungeon(&u.uz);
    lVar2 = lVar7 + 1;
  } while ((int)xVar3 + (int)(lVar7 + 1) < (int)xVar4);
  if (td == '\0') {
    pcVar9 = surface((int)u.ux,(int)u.uy);
    pline("The %s opens up under you!",pcVar9);
  }
  else {
    for (ptVar10 = level->lev_traps; ptVar10 != (trap *)0x0; ptVar10 = ptVar10->ntrap) {
      if ((ptVar10->tx == u.ux) && (ptVar10->ty == u.uy)) goto LAB_00261a72;
    }
    ptVar10 = (trap *)0x0;
LAB_00261a72:
    if ((ptVar10->field_0x8 & 0x20) == 0) {
      ptVar10->field_0x8 = ptVar10->field_0x8 | 0x20;
      newsym((int)ptVar10->tx,(int)ptVar10->ty);
    }
    if (u.uz.dnum != dungeon_topology.d_sokoban_dnum) {
      if ((ptVar10->field_0x8 & 0x1f) == 0xe) {
        pcVar9 = "A trap door opens up under you!";
      }
      else {
        pcVar9 = "There\'s a gaping hole under you!";
      }
      pline(pcVar9);
    }
  }
  iVar1 = (int)lVar7;
  if ((u.uz.dnum == dungeon_topology.d_sokoban_dnum) &&
     (bVar5 = can_fall_thru(level), bVar5 != '\0')) {
    pcVar9 = (char *)0x0;
    bVar11 = true;
  }
  else {
    pcVar9 = "You don\'t fall in.";
    if (u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) goto LAB_00261b23;
    bVar11 = false;
    if (((youmonst.data)->mlet != '\x05') && (u.ustuck == (monst *)0x0)) {
      bVar5 = can_fall_thru(level);
      bVar11 = false;
      if ((bVar5 != '\0') && (bVar11 = false, u.uprops[0x3c].extrinsic == 0)) {
        uVar6 = (youmonst.data)->mflags1;
        if ((uVar6 & 1) == 0) {
          if (u.usteed == (monst *)0x0) {
            if ((uVar6 & 0x10) == 0) goto LAB_00261cf4;
          }
          else if ((uVar6 & 0x10) == 0 && ((u.usteed)->data->mflags1 & 1) == 0) {
LAB_00261cf4:
            bVar5 = In_hell(&u.uz);
            if (((bVar5 == '\0') || ((u.uevent._1_1_ & 2) != 0)) ||
               (xVar4 = dunlevs_in_dungeon(&u.uz), iVar1 + ((int)local_140 - (int)xVar4) != -1)) {
              if ((youmonst.data)->msize < 4) {
                bVar5 = next_to_u();
                pcVar9 = (char *)0x0;
                bVar11 = bVar5 != '\0';
                if (!bVar11) {
                  pcVar9 = "You are jerked back by your pet!";
                }
                goto LAB_00261b25;
              }
              pcVar9 = "You don\'t fit through.";
            }
          }
        }
LAB_00261b23:
        bVar11 = false;
      }
    }
  }
LAB_00261b25:
  if (!bVar11) {
    pline(pcVar9);
    impact_drop((obj *)0x0,u.ux,u.uy,'\0');
    if (td != '\0') {
      return;
    }
    (*windowprocs.win_pause)(P_MESSAGE);
    pline("The opening under you closes up.");
    return;
  }
  if (u.ushops[0] != '\0') {
    shopdig(1);
  }
  bVar5 = on_level(&u.uz,&dungeon_topology.d_stronghold_level);
  if (bVar5 == '\0') {
    local_142.dnum = u.uz.dnum;
    local_142.dlevel = xVar3 + '\x01' + (char)lVar7;
    if (iVar1 - 1U < 4) {
      pcVar9 = fall_through_falling_down_msgs_rel +
               *(int *)("protected by the layer of grease!" + lVar7 * 4 + 0x20);
    }
    else {
      if (iVar1 == 0) goto LAB_00261c90;
      pline("You are falling down an unbelievably deep shaft!");
      pcVar9 = "While falling you wonder how unlikely it is to find such a deep shaft.";
    }
    pline(pcVar9);
  }
  else {
    find_hell(&local_142);
  }
LAB_00261c90:
  if (td == '\0') {
    pcVar8 = ceiling((int)u.ux,(int)u.uy);
    pcVar9 = local_138;
    sprintf(pcVar9,"The hole in the %s above you closes up.",pcVar8);
  }
  else {
    pcVar9 = (char *)0x0;
  }
  schedule_goto(&local_142,'\0','\x01',0,(char *)0x0,pcVar9);
  return;
}

Assistant:

void fall_through(boolean td)	/* td == TRUE : trap door or hole */
{
	d_level dtmp;
	char msgbuf[BUFSZ];
	const char *dont_fall = NULL;
	int currentlevel = dunlev(&u.uz);
	int newlevel = currentlevel;

	/* KMH -- You can't escape the Sokoban level traps */
	if (Blind && Levitation && !In_sokoban(&u.uz)) return;

	do {
	    newlevel++;
	} while (!rn2(4) && newlevel < dunlevs_in_dungeon(&u.uz));

	if (td) {
	    struct trap *t=t_at(level, u.ux,u.uy);
	    seetrap(t);
	    if (!In_sokoban(&u.uz)) {
		if (t->ttyp == TRAPDOOR)
			pline("A trap door opens up under you!");
		else 
			pline("There's a gaping hole under you!");
	    }
	} else pline("The %s opens up under you!", surface(u.ux,u.uy));

	if (In_sokoban(&u.uz) && can_fall_thru(level))
	    ;	/* KMH -- You can't escape the Sokoban level traps */
	else if (Levitation || u.ustuck || !can_fall_thru(level)
	   || Flying || is_clinger(youmonst.data)
	   || (Inhell && !u.uevent.invoked &&
					newlevel == dunlevs_in_dungeon(&u.uz))
		) {
	    dont_fall = "You don't fall in.";
	} else if (youmonst.data->msize >= MZ_HUGE) {
	    dont_fall = "You don't fit through.";
	} else if (!next_to_u()) {
	    dont_fall = "You are jerked back by your pet!";
	}
	if (dont_fall) {
	    pline(dont_fall);
	    /* hero didn't fall through, but any objects here might */
	    impact_drop(NULL, u.ux, u.uy, 0);
	    if (!td) {
		win_pause_output(P_MESSAGE);
		pline("The opening under you closes up.");
	    }
	    return;
	}

	if (*u.ushops) shopdig(1);
	if (Is_stronghold(&u.uz)) {
	    find_hell(&dtmp);
	} else {
	    static const char * const falling_down_msgs[] = {
		"You fall down a shaft!",
		"You fall down a deep shaft!",
		"You keep falling down a really deep shaft!",
		"You keep falling down an unbelievably deep shaft!",
		/* TODO: Hallucination messages */
	    };

	    dtmp.dnum = u.uz.dnum;
	    dtmp.dlevel = newlevel;

	    switch (newlevel - currentlevel) {
	    case 1:
		/* no message when falling to the next level */
		break;
	    case 2:
	    case 3:
	    case 4:
	    case 5:
		pline(falling_down_msgs[newlevel - currentlevel - 2]);
		break;
	    default:
		pline("You are falling down an unbelievably deep shaft!");
		pline("While falling you wonder how unlikely it is "
		      "to find such a deep shaft.");	/* (1/4)^5 ~= 0.1% */
		break;
	    }
	}
	if (!td)
	    sprintf(msgbuf, "The hole in the %s above you closes up.",
		    ceiling(u.ux,u.uy));
	schedule_goto(&dtmp, FALSE, TRUE, 0,
		      NULL, !td ? msgbuf : NULL);
}